

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesSamePoliciesTest10Subpart3<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section8AllCertificatesSamePoliciesTest10Subpart3<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_b8 [8];
  PkitsTestInfo info;
  char *crls [2];
  char *certs [3];
  Section8AllCertificatesSamePoliciesTest10Subpart3<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  crls[1] = "TrustAnchorRootCertificate";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  crls[0] = "PoliciesP12CACRL";
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_b8);
  local_b8 = (undefined1  [8])0x6f541a;
  info.time.year._0_1_ = 1;
  PkitsTestInfo::SetInitialPolicySet((PkitsTestInfo *)local_b8,"NIST-test-policy-2");
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_b8,"NIST-test-policy-2");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [3])(crls + 1),
             (char *(*) [2])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_b8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_b8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesSamePoliciesTest10Subpart3) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "PoliciesP12CACert",
                               "AllCertificatesSamePoliciesTest10EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "PoliciesP12CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.10";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-2");
  info.SetUserConstrainedPolicySet("NIST-test-policy-2");

  this->RunTest(certs, crls, info);
}